

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O0

void __thiscall CHuffman::Init(CHuffman *this,uint *pFrequencies)

{
  uint *in_RSI;
  CHuffman *in_RDI;
  CNode *pNode;
  int k;
  uint Bits;
  int i;
  uint in_stack_ffffffffffffffcc;
  CNode *local_28;
  int local_1c;
  uint local_18;
  uint local_14;
  uint *local_10;
  
  mem_zero(in_RDI,in_stack_ffffffffffffffcc);
  local_10 = in_RSI;
  if (in_RSI == (uint *)0x0) {
    local_10 = gs_aFreqTable;
  }
  ConstructTree(in_RDI,local_10);
  local_14 = 0;
  do {
    if (0x3ff < (int)local_14) {
      return;
    }
    local_18 = local_14;
    local_28 = in_RDI->m_pStartNode;
    for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
      local_28 = in_RDI->m_aNodes + local_28->m_aLeafs[local_18 & 1];
      local_18 = local_18 >> 1;
      if (local_28 == (CNode *)0x0) break;
      if (local_28->m_NumBits != 0) {
        in_RDI->m_apDecodeLut[(int)local_14] = local_28;
        break;
      }
    }
    if (local_1c == 10) {
      in_RDI->m_apDecodeLut[(int)local_14] = local_28;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void CHuffman::Init(const unsigned *pFrequencies)
{
	// make sure to cleanout every thing
	mem_zero(this, sizeof(*this));

	// construct the tree
	if(!pFrequencies)
		pFrequencies = gs_aFreqTable;
	ConstructTree(pFrequencies);

	// build decode LUT
	for(int i = 0; i < HUFFMAN_LUTSIZE; i++)
	{
		unsigned Bits = i;
		int k;
		CNode *pNode = m_pStartNode;
		for(k = 0; k < HUFFMAN_LUTBITS; k++)
		{
			pNode = &m_aNodes[pNode->m_aLeafs[Bits&1]];
			Bits >>= 1;

			if(!pNode)
				break;

			if(pNode->m_NumBits)
			{
				m_apDecodeLut[i] = pNode;
				break;
			}
		}

		if(k == HUFFMAN_LUTBITS)
			m_apDecodeLut[i] = pNode;
	}

}